

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int walIndexAppend(Wal *pWal,u32 iFrame,u32 iPage)

{
  void *__s;
  int iVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  u32 *local_38;
  
  iVar4 = (int)((ulong)(iFrame + 0x1000) + 0xffffffff021 >> 0xc);
  iVar1 = walIndexPage(pWal,iVar4,&local_38);
  if (iVar1 == 0) {
    iVar1 = iVar4 * 0x1000 + -0x22;
    lVar3 = 0;
    if (iVar4 == 0) {
      iVar1 = 0;
      lVar3 = 0x88;
    }
    __s = (void *)(lVar3 + (long)local_38);
    iVar4 = iFrame - iVar1;
    if (iVar4 == 1) {
      memset(__s,0,0x8000 - lVar3);
    }
    if (*(int *)((long)__s + (long)iVar4 * 4 + -4) != 0) {
      walCleanupHash(pWal);
    }
    uVar2 = (ulong)(iPage * 0x17f & 0x1fff);
    if (*(short *)((long)local_38 + uVar2 * 2 + 0x4000) != 0) {
      iVar1 = ~iFrame + iVar1;
      do {
        iVar1 = iVar1 + 1;
        if (iVar1 == 0) {
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xdae8,
                      "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
          return 0xb;
        }
        uVar2 = (ulong)((int)uVar2 + 1U & 0x1fff);
      } while (*(short *)((long)local_38 + uVar2 * 2 + 0x4000) != 0);
    }
    *(u32 *)((long)__s + (long)iVar4 * 4 + -4) = iPage;
    *(short *)((long)local_38 + uVar2 * 2 + 0x4000) = (short)iVar4;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int walIndexAppend(Wal *pWal, u32 iFrame, u32 iPage){
  int rc;                         /* Return code */
  u32 iZero = 0;                  /* One less than frame number of aPgno[1] */
  volatile u32 *aPgno = 0;        /* Page number array */
  volatile ht_slot *aHash = 0;    /* Hash table */

  rc = walHashGet(pWal, walFramePage(iFrame), &aHash, &aPgno, &iZero);

  /* Assuming the wal-index file was successfully mapped, populate the
  ** page number array and hash table entry.
  */
  if( rc==SQLITE_OK ){
    int iKey;                     /* Hash table key */
    int idx;                      /* Value to write to hash-table slot */
    int nCollide;                 /* Number of hash collisions */

    idx = iFrame - iZero;
    assert( idx <= HASHTABLE_NSLOT/2 + 1 );
    
    /* If this is the first entry to be added to this hash-table, zero the
    ** entire hash table and aPgno[] array before proceeding. 
    */
    if( idx==1 ){
      int nByte = (int)((u8 *)&aHash[HASHTABLE_NSLOT] - (u8 *)&aPgno[1]);
      memset((void*)&aPgno[1], 0, nByte);
    }

    /* If the entry in aPgno[] is already set, then the previous writer
    ** must have exited unexpectedly in the middle of a transaction (after
    ** writing one or more dirty pages to the WAL to free up memory). 
    ** Remove the remnants of that writers uncommitted transaction from 
    ** the hash-table before writing any new entries.
    */
    if( aPgno[idx] ){
      walCleanupHash(pWal);
      assert( !aPgno[idx] );
    }

    /* Write the aPgno[] array entry and the hash-table slot. */
    nCollide = idx;
    for(iKey=walHash(iPage); aHash[iKey]; iKey=walNextHash(iKey)){
      if( (nCollide--)==0 ) return SQLITE_CORRUPT_BKPT;
    }
    aPgno[idx] = iPage;
    aHash[iKey] = (ht_slot)idx;

#ifdef SQLITE_ENABLE_EXPENSIVE_ASSERT
    /* Verify that the number of entries in the hash table exactly equals
    ** the number of entries in the mapping region.
    */
    {
      int i;           /* Loop counter */
      int nEntry = 0;  /* Number of entries in the hash table */
      for(i=0; i<HASHTABLE_NSLOT; i++){ if( aHash[i] ) nEntry++; }
      assert( nEntry==idx );
    }

    /* Verify that the every entry in the mapping region is reachable
    ** via the hash table.  This turns out to be a really, really expensive
    ** thing to check, so only do this occasionally - not on every
    ** iteration.
    */
    if( (idx&0x3ff)==0 ){
      int i;           /* Loop counter */
      for(i=1; i<=idx; i++){
        for(iKey=walHash(aPgno[i]); aHash[iKey]; iKey=walNextHash(iKey)){
          if( aHash[iKey]==i ) break;
        }
        assert( aHash[iKey]==i );
      }
    }
#endif /* SQLITE_ENABLE_EXPENSIVE_ASSERT */
  }


  return rc;
}